

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hpp
# Opt level: O1

rb_tree_node<int> * __thiscall
nestl::test::allocator_with_state<nestl::impl::detail::rb_tree_node<int>_>::
allocate<nestl::has_exceptions::exception_ptr_error>
          (allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *this,
          exception_ptr_error *err,size_t n,void *param_3)

{
  rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
  *prVar1;
  rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
  *this_00;
  rb_tree_node<int> *prVar2;
  rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
  *prVar3;
  rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
  *prVar4;
  default_operation_error _;
  rb_tree_node<int> *local_28;
  exception_ptr local_20;
  
  prVar2 = (rb_tree_node<int> *)operator_new(n * 0x28,(nothrow_t *)&std::nothrow);
  if (prVar2 == (rb_tree_node<int> *)0x0) {
    local_28 = (rb_tree_node<int> *)operator_delete;
    has_exceptions::from_exception<std::bad_alloc>(err,(bad_alloc *)&local_28);
    std::bad_alloc::~bad_alloc((bad_alloc *)&local_28);
    return (rb_tree_node<int> *)0x0;
  }
  this_00 = (rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
             *)(this->m_allocated_storage).m_ptr;
  if (this_00 !=
      (rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
       *)0x0) {
    prVar1 = this_00 + 8;
    prVar3 = prVar1;
    for (prVar4 = *(rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
                    **)(this_00 + 0x10);
        prVar4 != (rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
                   *)0x0;
        prVar4 = *(rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
                   **)(prVar4 + (ulong)(*(rb_tree_node<int> **)(prVar4 + 0x20) < prVar2) * 8 + 0x10)
        ) {
      if (*(rb_tree_node<int> **)(prVar4 + 0x20) >= prVar2) {
        prVar3 = prVar4;
      }
    }
    prVar4 = prVar1;
    if ((prVar3 != prVar1) && (prVar4 = prVar3, prVar2 < *(rb_tree_node<int> **)(prVar3 + 0x20))) {
      prVar4 = prVar1;
    }
    local_28 = prVar2;
    if (prVar4 == prVar1) {
      local_20._M_exception_object = (void *)0x0;
      impl::detail::
      rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
      ::m_insert_unique<nestl::has_exceptions::exception_ptr_error,void*>
                (this_00,(exception_ptr_error *)&local_20,&local_28);
      local_28 = (rb_tree_node<int> *)0x1095f5;
      if (local_20._M_exception_object == (void *)0x0) {
        return prVar2;
      }
      detail::
      print_tuple<char_const(&)[11],char_const*&,char_const(&)[31],nestl::has_exceptions::exception_ptr_error_const&>
                ((ostream *)&std::cerr,(char (*) [11])"operation ",(char **)&local_28,
                 (char (*) [31])" failed with following error: ",(exception_ptr_error *)&local_20);
    }
    else {
      detail::print_tuple<char_const(&)[10],void*,char_const(&)[35]>
                ((ostream *)&std::cerr,(char (*) [10])"pointer [",&local_28,
                 (char (*) [35])"] already belong to this allocator");
    }
    abort();
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/shared_ptr.hpp"
                ,0x1e7,
                "typename shared_ptr<T>::element_type *nestl::impl::shared_ptr<nestl::impl::set<void *>>::operator->() const [T = nestl::impl::set<void *>]"
               );
}

Assistant:

T* allocate(OperationError& err, std::size_t n, const void* /* hint */ = 0) NESTL_NOEXCEPT_SPEC
    {
        auto res = static_cast<T*>(::operator new(n * sizeof(value_type), std::nothrow));
        if (!res)
        {
            build_bad_alloc(err);
            return nullptr;
        }

        nestl::set<void*>::const_iterator pos = m_allocated_storage->find(res);
        if (pos != m_allocated_storage->end())
        {
            fatal_failure("pointer [", static_cast<void*>(res), "] already belong to this allocator");
        }

        NESTL_CHECK_OPERATION(m_allocated_storage->insert_nothrow(_, res));

        return res;
    }